

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmq.c
# Opt level: O2

void nni_lmq_init(nni_lmq *lmq,size_t cap)

{
  lmq->lmq_alloc = 0;
  lmq->lmq_mask = 0;
  lmq->lmq_len = 0;
  lmq->lmq_get = 0;
  lmq->lmq_put = 0;
  lmq->lmq_msgs = lmq->lmq_buf;
  lmq->lmq_cap = 2;
  lmq->lmq_mask = 1;
  if (2 < cap) {
    nni_lmq_resize(lmq,cap);
    return;
  }
  lmq->lmq_cap = cap;
  return;
}

Assistant:

void
nni_lmq_init(nni_lmq *lmq, size_t cap)
{
	lmq->lmq_len = 0;
	lmq->lmq_get = 0;
	lmq->lmq_put = 0;
	lmq->lmq_alloc = 0;
	lmq->lmq_mask = 0;
	lmq->lmq_msgs = NULL;
	lmq->lmq_msgs = lmq->lmq_buf;
	lmq->lmq_cap = 2;
	lmq->lmq_mask = 0x1; // only index 0 and 1
	if (cap > 2) {
		(void) nni_lmq_resize(lmq, cap);
	} else {
		lmq->lmq_cap = cap;
	}
}